

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__bmp_parse_header(stbi__context *s,stbi__bmp_data *info)

{
  stbi_uc sVar1;
  stbi_uc sVar2;
  stbi__uint32 sVar3;
  stbi__uint32 sVar4;
  int iVar5;
  
  sVar1 = stbi__get8(s);
  if ((sVar1 != 'B') || (sVar1 = stbi__get8(s), sVar1 != 'M')) {
    stbi__g_failure_reason = "not BMP";
    return (void *)0x0;
  }
  stbi__get32le(s);
  stbi__get8(s);
  stbi__get8(s);
  stbi__get8(s);
  stbi__get8(s);
  sVar3 = stbi__get32le(s);
  info->offset = sVar3;
  sVar3 = stbi__get32le(s);
  info->hsz = sVar3;
  info->mr = 0;
  info->mg = 0;
  info->mb = 0;
  info->ma = 0;
  if ((int)sVar3 < 0x38) {
    if (sVar3 != 0xc) {
      if (sVar3 != 0x28) goto LAB_0010f4aa;
      goto LAB_0010f3fb;
    }
    sVar1 = stbi__get8(s);
    sVar2 = stbi__get8(s);
    s->img_x = (uint)CONCAT11(sVar2,sVar1);
    sVar1 = stbi__get8(s);
    sVar2 = stbi__get8(s);
    sVar4 = (stbi__uint32)CONCAT11(sVar2,sVar1);
  }
  else {
    if (((sVar3 != 0x38) && (sVar3 != 0x6c)) && (sVar3 != 0x7c)) {
LAB_0010f4aa:
      stbi__g_failure_reason = "unknown BMP";
      return (void *)0x0;
    }
LAB_0010f3fb:
    sVar4 = stbi__get32le(s);
    s->img_x = sVar4;
    sVar4 = stbi__get32le(s);
  }
  s->img_y = sVar4;
  sVar1 = stbi__get8(s);
  sVar2 = stbi__get8(s);
  if (CONCAT11(sVar2,sVar1) == 1) {
    sVar1 = stbi__get8(s);
    sVar2 = stbi__get8(s);
    info->bpp = (uint)CONCAT11(sVar2,sVar1);
    if (sVar3 == 0xc) {
      return (void *)0x1;
    }
    sVar4 = stbi__get32le(s);
    if (sVar4 - 1 < 2) {
      stbi__g_failure_reason = "BMP RLE";
      return (void *)0x0;
    }
    stbi__get32le(s);
    stbi__get32le(s);
    stbi__get32le(s);
    stbi__get32le(s);
    stbi__get32le(s);
    if ((int)sVar3 < 0x6c) {
      if (sVar3 != 0x28) {
        if (sVar3 != 0x38) goto LAB_0010f65d;
        stbi__get32le(s);
        stbi__get32le(s);
        stbi__get32le(s);
        stbi__get32le(s);
      }
      iVar5 = info->bpp;
      if ((iVar5 != 0x20) && (iVar5 != 0x10)) {
        return (void *)0x1;
      }
      if (sVar4 == 3) {
        sVar3 = stbi__get32le(s);
        info->mr = sVar3;
        sVar3 = stbi__get32le(s);
        info->mg = sVar3;
        sVar3 = stbi__get32le(s);
        info->mb = sVar3;
        if (info->mg != sVar3 || info->mr != info->mg) {
          return (void *)0x1;
        }
      }
      else if (sVar4 == 0) {
        if (iVar5 != 0x20) {
          info->mr = 0x7c00;
          info->mg = 0x3e0;
          info->mb = 0x1f;
          return (void *)0x1;
        }
        info->mr = 0xff0000;
        info->mg = 0xff00;
        info->mb = 0xff;
        info->ma = 0xff000000;
        info->all_a = 0;
        return (void *)0x1;
      }
    }
    else if ((sVar3 == 0x6c) || (sVar3 == 0x7c)) {
      sVar4 = stbi__get32le(s);
      info->mr = sVar4;
      sVar4 = stbi__get32le(s);
      info->mg = sVar4;
      sVar4 = stbi__get32le(s);
      info->mb = sVar4;
      sVar4 = stbi__get32le(s);
      info->ma = sVar4;
      stbi__get32le(s);
      iVar5 = 0xc;
      do {
        stbi__get32le(s);
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
      if (sVar3 != 0x6c) {
        if (sVar3 != 0x7c) {
          return (void *)0x0;
        }
        stbi__get32le(s);
        stbi__get32le(s);
        stbi__get32le(s);
        stbi__get32le(s);
        return (void *)0x1;
      }
      return (void *)0x1;
    }
  }
LAB_0010f65d:
  stbi__g_failure_reason = "bad BMP";
  return (void *)0x0;
}

Assistant:

static void *stbi__bmp_parse_header(stbi__context *s, stbi__bmp_data *info)
{
   int hsz;
   if (stbi__get8(s) != 'B' || stbi__get8(s) != 'M') return stbi__errpuc("not BMP", "Corrupt BMP");
   stbi__get32le(s); // discard filesize
   stbi__get16le(s); // discard reserved
   stbi__get16le(s); // discard reserved
   info->offset = stbi__get32le(s);
   info->hsz = hsz = stbi__get32le(s);
   info->mr = info->mg = info->mb = info->ma = 0;

   if (hsz != 12 && hsz != 40 && hsz != 56 && hsz != 108 && hsz != 124) return stbi__errpuc("unknown BMP", "BMP type not supported: unknown");
   if (hsz == 12) {
      s->img_x = stbi__get16le(s);
      s->img_y = stbi__get16le(s);
   } else {
      s->img_x = stbi__get32le(s);
      s->img_y = stbi__get32le(s);
   }
   if (stbi__get16le(s) != 1) return stbi__errpuc("bad BMP", "bad BMP");
   info->bpp = stbi__get16le(s);
   if (hsz != 12) {
      int compress = stbi__get32le(s);
      if (compress == 1 || compress == 2) return stbi__errpuc("BMP RLE", "BMP type not supported: RLE");
      stbi__get32le(s); // discard sizeof
      stbi__get32le(s); // discard hres
      stbi__get32le(s); // discard vres
      stbi__get32le(s); // discard colorsused
      stbi__get32le(s); // discard max important
      if (hsz == 40 || hsz == 56) {
         if (hsz == 56) {
            stbi__get32le(s);
            stbi__get32le(s);
            stbi__get32le(s);
            stbi__get32le(s);
         }
         if (info->bpp == 16 || info->bpp == 32) {
            if (compress == 0) {
               if (info->bpp == 32) {
                  info->mr = 0xffu << 16;
                  info->mg = 0xffu <<  8;
                  info->mb = 0xffu <<  0;
                  info->ma = 0xffu << 24;
                  info->all_a = 0; // if all_a is 0 at end, then we loaded alpha channel but it was all 0
               } else {
                  info->mr = 31u << 10;
                  info->mg = 31u <<  5;
                  info->mb = 31u <<  0;
               }
            } else if (compress == 3) {
               info->mr = stbi__get32le(s);
               info->mg = stbi__get32le(s);
               info->mb = stbi__get32le(s);
               // not documented, but generated by photoshop and handled by mspaint
               if (info->mr == info->mg && info->mg == info->mb) {
                  // ?!?!?
                  return stbi__errpuc("bad BMP", "bad BMP");
               }
            } else
               return stbi__errpuc("bad BMP", "bad BMP");
         }
      } else {
         int i;
         if (hsz != 108 && hsz != 124)
            return stbi__errpuc("bad BMP", "bad BMP");
         info->mr = stbi__get32le(s);
         info->mg = stbi__get32le(s);
         info->mb = stbi__get32le(s);
         info->ma = stbi__get32le(s);
         stbi__get32le(s); // discard color space
         for (i=0; i < 12; ++i)
            stbi__get32le(s); // discard color space parameters
         if (hsz == 124) {
            stbi__get32le(s); // discard rendering intent
            stbi__get32le(s); // discard offset of profile data
            stbi__get32le(s); // discard size of profile data
            stbi__get32le(s); // discard reserved
         }
      }
   }
   return (void *) 1;
}